

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_inr
          (CImg<unsigned_char> *this,FILE *file,char *filename,float *voxel_size)

{
  ushort *puVar1;
  bool bVar2;
  uint uVar3;
  unsigned_short *ptr;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  long lVar7;
  long lVar8;
  char *pcVar9;
  pointer_____offset_0x10___ *ppuVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  void *pvVar14;
  long lVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  int fopt [8];
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  FILE *local_40;
  char *local_38;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar9 = "non-";
    if (this->_is_shared != false) {
      pcVar9 = "";
    }
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_inr(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar9,"unsigned char");
    ppuVar10 = &CImgArgumentException::typeinfo;
  }
  else {
    local_40 = file;
    if (file == (FILE *)0x0) {
      file = (FILE *)cimg::fopen(filename,"rb");
    }
    if (voxel_size != (float *)0x0) {
      voxel_size[2] = 1.0;
      voxel_size[0] = 1.0;
      voxel_size[1] = 1.0;
    }
    local_38 = filename;
    _load_inr_header(file,(int *)&local_68,voxel_size);
    assign(this,local_68,local_64,local_60,local_5c);
    bVar2 = false;
    if (((local_50 == 8) && (bVar2 = false, local_58 == 0)) && (local_54 == 0)) {
      pvVar4 = operator_new__((long)(int)local_5c * (long)(int)local_68);
      if (0 < (int)this->_depth) {
        lVar8 = 0;
        do {
          if (0 < (int)this->_height) {
            lVar17 = 0;
            do {
              uVar18 = (long)(int)local_5c * (long)(int)local_68;
              if ((FILE *)file == (FILE *)0x0) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar9 = "";
                if (1 < (uint)uVar18) {
                  pcVar9 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,uVar18,"unsigned char",pcVar9,0,pvVar4);
                goto LAB_001adbf9;
              }
              if ((uint)uVar18 != 0) {
                lVar15 = 0;
                local_48 = uVar18;
                do {
                  sVar16 = 0x3f00000;
                  if (uVar18 < 0x3f00000) {
                    sVar16 = uVar18;
                  }
                  sVar5 = fread((void *)((long)pvVar4 + lVar15),1,sVar16,(FILE *)file);
                  lVar15 = lVar15 + sVar5;
                  uVar18 = uVar18 - sVar5;
                } while ((sVar16 == sVar5) && (uVar18 != 0));
                if (uVar18 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.");
                }
              }
              if (0 < (int)this->_width) {
                lVar15 = 0;
                pvVar14 = pvVar4;
                do {
                  if (0 < (int)this->_spectrum) {
                    lVar7 = 0;
                    do {
                      lVar12 = (ulong)this->_height * (ulong)this->_width;
                      this->_data
                      [(ulong)this->_depth * lVar7 * lVar12 +
                       lVar12 * lVar8 + lVar15 + lVar17 * (ulong)this->_width] =
                           *(uchar *)((long)pvVar14 + lVar7);
                      lVar7 = lVar7 + 1;
                    } while (lVar7 < (int)this->_spectrum);
                    pvVar14 = (void *)((long)pvVar14 + lVar7);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (int)this->_width);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)this->_height);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_depth);
      }
      operator_delete__(pvVar4);
      bVar2 = true;
    }
    if (((!bVar2) && (local_50 == 8)) && ((local_58 == 0 && (local_54 == 1)))) {
      pvVar4 = operator_new__((long)(int)local_5c * (long)(int)local_68);
      if (0 < (int)this->_depth) {
        lVar8 = 0;
        do {
          if (0 < (int)this->_height) {
            lVar17 = 0;
            do {
              uVar18 = (long)(int)local_5c * (long)(int)local_68;
              if ((FILE *)file == (FILE *)0x0) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar9 = "";
                if (1 < (uint)uVar18) {
                  pcVar9 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,uVar18,"char",pcVar9,0,pvVar4);
                goto LAB_001adbf9;
              }
              if ((uint)uVar18 != 0) {
                lVar15 = 0;
                local_48 = uVar18;
                do {
                  sVar16 = 0x3f00000;
                  if (uVar18 < 0x3f00000) {
                    sVar16 = uVar18;
                  }
                  sVar5 = fread((void *)((long)pvVar4 + lVar15),1,sVar16,(FILE *)file);
                  lVar15 = lVar15 + sVar5;
                  uVar18 = uVar18 - sVar5;
                } while ((sVar16 == sVar5) && (uVar18 != 0));
                if (uVar18 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.");
                }
              }
              if (0 < (int)this->_width) {
                lVar15 = 0;
                pvVar14 = pvVar4;
                do {
                  if (0 < (int)this->_spectrum) {
                    lVar7 = 0;
                    do {
                      lVar12 = (ulong)this->_height * (ulong)this->_width;
                      this->_data
                      [(ulong)this->_depth * lVar7 * lVar12 +
                       lVar12 * lVar8 + lVar15 + lVar17 * (ulong)this->_width] =
                           *(uchar *)((long)pvVar14 + lVar7);
                      lVar7 = lVar7 + 1;
                    } while (lVar7 < (int)this->_spectrum);
                    pvVar14 = (void *)((long)pvVar14 + lVar7);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (int)this->_width);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)this->_height);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_depth);
      }
      operator_delete__(pvVar4);
      bVar2 = true;
    }
    if ((((!bVar2) && (local_50 == 0x10)) && (local_58 == 0)) && (local_54 == 0)) {
      uVar18 = 0xffffffffffffffff;
      if (-1 < (long)(int)local_5c * (long)(int)local_68) {
        uVar18 = (long)(int)local_5c * (long)(int)local_68 * 2;
      }
      pvVar4 = operator_new__(uVar18);
      if (0 < (int)this->_depth) {
        lVar8 = 0;
        do {
          if (0 < (int)this->_height) {
            lVar17 = 0;
            do {
              sVar16 = (long)(int)local_5c * (long)(int)local_68;
              if ((FILE *)file == (FILE *)0x0) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar9 = "";
                if (1 < (uint)sVar16) {
                  pcVar9 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,sVar16,"unsigned short",pcVar9,0,pvVar4);
                goto LAB_001adbf9;
              }
              if ((uint)sVar16 != 0) {
                lVar15 = 0;
                local_48 = sVar16;
                do {
                  sVar5 = 0x1f80000;
                  if (sVar16 * 2 < 0x3f00000) {
                    sVar5 = sVar16;
                  }
                  sVar6 = fread((void *)((long)pvVar4 + lVar15 * 2),2,sVar5,(FILE *)file);
                  lVar15 = lVar15 + sVar6;
                  sVar16 = sVar16 - sVar6;
                } while ((sVar5 == sVar6) && (sVar16 != 0));
                if (sVar16 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.");
                }
              }
              if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
                pvVar14 = (void *)((ulong)(local_5c * local_68) * 2 + (long)pvVar4);
                do {
                  puVar1 = (ushort *)((long)pvVar14 + -2);
                  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                  pvVar14 = (void *)((long)pvVar14 + -2);
                } while (pvVar4 < pvVar14);
              }
              if (0 < (int)this->_width) {
                lVar15 = 0;
                pvVar14 = pvVar4;
                do {
                  if (0 < (int)this->_spectrum) {
                    lVar7 = 0;
                    lVar12 = 0;
                    do {
                      lVar13 = (ulong)this->_height * (ulong)this->_width;
                      this->_data
                      [(ulong)this->_depth * lVar12 * lVar13 +
                       lVar13 * lVar8 + lVar15 + lVar17 * (ulong)this->_width] =
                           *(uchar *)((long)pvVar14 + lVar12 * 2);
                      lVar12 = lVar12 + 1;
                      lVar7 = lVar7 + 2;
                    } while (lVar12 < (int)this->_spectrum);
                    pvVar14 = (void *)((long)pvVar14 + lVar7);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (int)this->_width);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)this->_height);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_depth);
      }
      operator_delete__(pvVar4);
      bVar2 = true;
    }
    if ((((!bVar2) && (local_50 == 0x10)) && (local_58 == 0)) && (local_54 == 1)) {
      uVar18 = 0xffffffffffffffff;
      if (-1 < (long)(int)local_5c * (long)(int)local_68) {
        uVar18 = (long)(int)local_5c * (long)(int)local_68 * 2;
      }
      pvVar4 = operator_new__(uVar18);
      if (0 < (int)this->_depth) {
        lVar8 = 0;
        do {
          if (0 < (int)this->_height) {
            lVar17 = 0;
            do {
              sVar16 = (long)(int)local_5c * (long)(int)local_68;
              if ((FILE *)file == (FILE *)0x0) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar9 = "";
                if (1 < (uint)sVar16) {
                  pcVar9 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,sVar16,"short",pcVar9,0,pvVar4);
                goto LAB_001adbf9;
              }
              if ((uint)sVar16 != 0) {
                lVar15 = 0;
                local_48 = sVar16;
                do {
                  sVar5 = 0x1f80000;
                  if (sVar16 * 2 < 0x3f00000) {
                    sVar5 = sVar16;
                  }
                  sVar6 = fread((void *)((long)pvVar4 + lVar15 * 2),2,sVar5,(FILE *)file);
                  lVar15 = lVar15 + sVar6;
                  sVar16 = sVar16 - sVar6;
                } while ((sVar5 == sVar6) && (sVar16 != 0));
                if (sVar16 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.");
                }
              }
              if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
                pvVar14 = (void *)((ulong)(local_5c * local_68) * 2 + (long)pvVar4);
                do {
                  puVar1 = (ushort *)((long)pvVar14 + -2);
                  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                  pvVar14 = (void *)((long)pvVar14 + -2);
                } while (pvVar4 < pvVar14);
              }
              if (0 < (int)this->_width) {
                lVar15 = 0;
                pvVar14 = pvVar4;
                do {
                  if (0 < (int)this->_spectrum) {
                    lVar7 = 0;
                    lVar12 = 0;
                    do {
                      lVar13 = (ulong)this->_height * (ulong)this->_width;
                      this->_data
                      [(ulong)this->_depth * lVar12 * lVar13 +
                       lVar13 * lVar8 + lVar15 + lVar17 * (ulong)this->_width] =
                           *(uchar *)((long)pvVar14 + lVar12 * 2);
                      lVar12 = lVar12 + 1;
                      lVar7 = lVar7 + 2;
                    } while (lVar12 < (int)this->_spectrum);
                    pvVar14 = (void *)((long)pvVar14 + lVar7);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (int)this->_width);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)this->_height);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_depth);
      }
      operator_delete__(pvVar4);
      bVar2 = true;
    }
    if ((((!bVar2) && (local_50 == 0x20)) && (local_58 == 0)) && (local_54 == 0)) {
      uVar18 = 0xffffffffffffffff;
      if ((ulong)((long)(int)local_5c * (long)(int)local_68) < 0x4000000000000000) {
        uVar18 = (long)(int)local_5c * (long)(int)local_68 * 4;
      }
      pvVar4 = operator_new__(uVar18);
      if (0 < (int)this->_depth) {
        lVar8 = 0;
        do {
          if (0 < (int)this->_height) {
            lVar17 = 0;
            do {
              sVar16 = (long)(int)local_5c * (long)(int)local_68;
              if ((FILE *)file == (FILE *)0x0) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar9 = "";
                if (1 < (uint)sVar16) {
                  pcVar9 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,sVar16,"unsigned int",pcVar9,0,pvVar4);
                goto LAB_001adbf9;
              }
              if ((uint)sVar16 != 0) {
                lVar15 = 0;
                local_48 = sVar16;
                do {
                  sVar5 = 0xfc0000;
                  if (sVar16 * 4 < 0x3f00000) {
                    sVar5 = sVar16;
                  }
                  sVar6 = fread((void *)((long)pvVar4 + lVar15 * 4),4,sVar5,(FILE *)file);
                  lVar15 = lVar15 + sVar6;
                  sVar16 = sVar16 - sVar6;
                } while ((sVar5 == sVar6) && (sVar16 != 0));
                if (sVar16 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.");
                }
              }
              if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
                pvVar14 = (void *)((ulong)(local_5c * local_68) * 4 + (long)pvVar4);
                do {
                  uVar3 = *(uint *)((long)pvVar14 - 4);
                  *(uint *)((long)pvVar14 - 4) =
                       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18;
                  pvVar14 = (void *)((long)pvVar14 - 4);
                } while (pvVar4 < pvVar14);
              }
              if (0 < (int)this->_width) {
                lVar15 = 0;
                pvVar14 = pvVar4;
                do {
                  if (0 < (int)this->_spectrum) {
                    lVar7 = 0;
                    lVar12 = 0;
                    do {
                      lVar13 = (ulong)this->_height * (ulong)this->_width;
                      this->_data
                      [(ulong)this->_depth * lVar12 * lVar13 +
                       lVar13 * lVar8 + lVar15 + lVar17 * (ulong)this->_width] =
                           *(uchar *)((long)pvVar14 + lVar12 * 4);
                      lVar12 = lVar12 + 1;
                      lVar7 = lVar7 + 4;
                    } while (lVar12 < (int)this->_spectrum);
                    pvVar14 = (void *)((long)pvVar14 + lVar7);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (int)this->_width);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)this->_height);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_depth);
      }
      operator_delete__(pvVar4);
      bVar2 = true;
    }
    if ((((!bVar2) && (local_50 == 0x20)) && (local_58 == 0)) && (local_54 == 1)) {
      uVar18 = 0xffffffffffffffff;
      if ((ulong)((long)(int)local_5c * (long)(int)local_68) < 0x4000000000000000) {
        uVar18 = (long)(int)local_5c * (long)(int)local_68 * 4;
      }
      pvVar4 = operator_new__(uVar18);
      if (0 < (int)this->_depth) {
        lVar8 = 0;
        do {
          if (0 < (int)this->_height) {
            lVar17 = 0;
            do {
              sVar16 = (long)(int)local_5c * (long)(int)local_68;
              if ((FILE *)file == (FILE *)0x0) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar9 = "";
                if (1 < (uint)sVar16) {
                  pcVar9 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,sVar16,"int",pcVar9,0,pvVar4);
                goto LAB_001adbf9;
              }
              if ((uint)sVar16 != 0) {
                lVar15 = 0;
                local_48 = sVar16;
                do {
                  sVar5 = 0xfc0000;
                  if (sVar16 * 4 < 0x3f00000) {
                    sVar5 = sVar16;
                  }
                  sVar6 = fread((void *)((long)pvVar4 + lVar15 * 4),4,sVar5,(FILE *)file);
                  lVar15 = lVar15 + sVar6;
                  sVar16 = sVar16 - sVar6;
                } while ((sVar5 == sVar6) && (sVar16 != 0));
                if (sVar16 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.");
                }
              }
              if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
                pvVar14 = (void *)((ulong)(local_5c * local_68) * 4 + (long)pvVar4);
                do {
                  uVar3 = *(uint *)((long)pvVar14 - 4);
                  *(uint *)((long)pvVar14 - 4) =
                       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18;
                  pvVar14 = (void *)((long)pvVar14 - 4);
                } while (pvVar4 < pvVar14);
              }
              if (0 < (int)this->_width) {
                lVar15 = 0;
                pvVar14 = pvVar4;
                do {
                  if (0 < (int)this->_spectrum) {
                    lVar7 = 0;
                    lVar12 = 0;
                    do {
                      lVar13 = (ulong)this->_height * (ulong)this->_width;
                      this->_data
                      [(ulong)this->_depth * lVar12 * lVar13 +
                       lVar13 * lVar8 + lVar15 + lVar17 * (ulong)this->_width] =
                           *(uchar *)((long)pvVar14 + lVar12 * 4);
                      lVar12 = lVar12 + 1;
                      lVar7 = lVar7 + 4;
                    } while (lVar12 < (int)this->_spectrum);
                    pvVar14 = (void *)((long)pvVar14 + lVar7);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (int)this->_width);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)this->_height);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_depth);
      }
      operator_delete__(pvVar4);
      bVar2 = true;
    }
    if ((((!bVar2) && (local_50 == 0x20)) && (local_58 == 1)) && (local_54 == 0)) {
      uVar18 = 0xffffffffffffffff;
      if ((ulong)((long)(int)local_5c * (long)(int)local_68) < 0x4000000000000000) {
        uVar18 = (long)(int)local_5c * (long)(int)local_68 * 4;
      }
      pvVar4 = operator_new__(uVar18);
      if (0 < (int)this->_depth) {
        lVar8 = 0;
        do {
          if (0 < (int)this->_height) {
            lVar17 = 0;
            do {
              sVar16 = (long)(int)local_5c * (long)(int)local_68;
              if ((FILE *)file == (FILE *)0x0) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar9 = "";
                if (1 < (uint)sVar16) {
                  pcVar9 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,sVar16,"float",pcVar9,0,pvVar4);
                goto LAB_001adbf9;
              }
              if ((uint)sVar16 != 0) {
                lVar15 = 0;
                local_48 = sVar16;
                do {
                  sVar5 = 0xfc0000;
                  if (sVar16 * 4 < 0x3f00000) {
                    sVar5 = sVar16;
                  }
                  sVar6 = fread((void *)((long)pvVar4 + lVar15 * 4),4,sVar5,(FILE *)file);
                  lVar15 = lVar15 + sVar6;
                  sVar16 = sVar16 - sVar6;
                } while ((sVar5 == sVar6) && (sVar16 != 0));
                if (sVar16 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.");
                }
              }
              if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
                pvVar14 = (void *)((ulong)(local_5c * local_68) * 4 + (long)pvVar4);
                do {
                  uVar3 = *(uint *)((long)pvVar14 - 4);
                  *(uint *)((long)pvVar14 - 4) =
                       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18;
                  pvVar14 = (void *)((long)pvVar14 - 4);
                } while (pvVar4 < pvVar14);
              }
              if (0 < (int)this->_width) {
                lVar15 = 0;
                pvVar14 = pvVar4;
                do {
                  if (0 < (int)this->_spectrum) {
                    lVar7 = 0;
                    lVar12 = 0;
                    do {
                      lVar13 = (ulong)this->_height * (ulong)this->_width;
                      this->_data
                      [(ulong)this->_depth * lVar12 * lVar13 +
                       lVar13 * lVar8 + lVar15 + lVar17 * (ulong)this->_width] =
                           (uchar)(int)*(float *)((long)pvVar14 + lVar12 * 4);
                      lVar12 = lVar12 + 1;
                      lVar7 = lVar7 + 4;
                    } while (lVar12 < (int)this->_spectrum);
                    pvVar14 = (void *)((long)pvVar14 + lVar7);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (int)this->_width);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)this->_height);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_depth);
      }
      operator_delete__(pvVar4);
      bVar2 = true;
    }
    if ((((!bVar2) && (local_50 == 0x20)) && (local_58 == 1)) && (local_54 == 1)) {
      uVar18 = 0xffffffffffffffff;
      if ((ulong)((long)(int)local_5c * (long)(int)local_68) < 0x4000000000000000) {
        uVar18 = (long)(int)local_5c * (long)(int)local_68 * 4;
      }
      pvVar4 = operator_new__(uVar18);
      if (0 < (int)this->_depth) {
        lVar8 = 0;
        do {
          if (0 < (int)this->_height) {
            lVar17 = 0;
            do {
              sVar16 = (long)(int)local_5c * (long)(int)local_68;
              if ((FILE *)file == (FILE *)0x0) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar9 = "";
                if (1 < (uint)sVar16) {
                  pcVar9 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,sVar16,"float",pcVar9,0,pvVar4);
                goto LAB_001adbf9;
              }
              if ((uint)sVar16 != 0) {
                lVar15 = 0;
                local_48 = sVar16;
                do {
                  sVar5 = 0xfc0000;
                  if (sVar16 * 4 < 0x3f00000) {
                    sVar5 = sVar16;
                  }
                  sVar6 = fread((void *)((long)pvVar4 + lVar15 * 4),4,sVar5,(FILE *)file);
                  lVar15 = lVar15 + sVar6;
                  sVar16 = sVar16 - sVar6;
                } while ((sVar5 == sVar6) && (sVar16 != 0));
                if (sVar16 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.");
                }
              }
              if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
                pvVar14 = (void *)((ulong)(local_5c * local_68) * 4 + (long)pvVar4);
                do {
                  uVar3 = *(uint *)((long)pvVar14 - 4);
                  *(uint *)((long)pvVar14 - 4) =
                       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                       uVar3 << 0x18;
                  pvVar14 = (void *)((long)pvVar14 - 4);
                } while (pvVar4 < pvVar14);
              }
              if (0 < (int)this->_width) {
                lVar15 = 0;
                pvVar14 = pvVar4;
                do {
                  if (0 < (int)this->_spectrum) {
                    lVar7 = 0;
                    lVar12 = 0;
                    do {
                      lVar13 = (ulong)this->_height * (ulong)this->_width;
                      this->_data
                      [(ulong)this->_depth * lVar12 * lVar13 +
                       lVar13 * lVar8 + lVar15 + lVar17 * (ulong)this->_width] =
                           (uchar)(int)*(float *)((long)pvVar14 + lVar12 * 4);
                      lVar12 = lVar12 + 1;
                      lVar7 = lVar7 + 4;
                    } while (lVar12 < (int)this->_spectrum);
                    pvVar14 = (void *)((long)pvVar14 + lVar7);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (int)this->_width);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)this->_height);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_depth);
      }
      operator_delete__(pvVar4);
      bVar2 = true;
    }
    if ((((!bVar2) && (local_50 == 0x40)) && (local_58 == 1)) && (local_54 == 0)) {
      pvVar4 = operator_new__(-(ulong)((ulong)((long)(int)local_5c * (long)(int)local_68) >> 0x3d !=
                                      0) | (long)(int)local_5c * (long)(int)local_68 * 8);
      if (0 < (int)this->_depth) {
        lVar8 = 0;
        do {
          if (0 < (int)this->_height) {
            lVar17 = 0;
            do {
              sVar16 = (long)(int)local_5c * (long)(int)local_68;
              if ((FILE *)file == (FILE *)0x0) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar9 = "";
                if (1 < (uint)sVar16) {
                  pcVar9 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,sVar16,"double",pcVar9,0,pvVar4);
                goto LAB_001adbf9;
              }
              if ((uint)sVar16 != 0) {
                lVar15 = 0;
                local_48 = sVar16;
                do {
                  sVar5 = 0x7e0000;
                  if (sVar16 * 8 < 0x3f00000) {
                    sVar5 = sVar16;
                  }
                  sVar6 = fread((void *)((long)pvVar4 + lVar15 * 8),8,sVar5,(FILE *)file);
                  lVar15 = lVar15 + sVar6;
                  sVar16 = sVar16 - sVar6;
                } while ((sVar5 == sVar6) && (sVar16 != 0));
                if (sVar16 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.");
                }
              }
              if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
                pvVar14 = (void *)((ulong)(local_5c * local_68) * 8 + (long)pvVar4);
                do {
                  uVar18 = *(ulong *)((long)pvVar14 - 8);
                  *(ulong *)((long)pvVar14 - 8) =
                       uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                       (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                       (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                       (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
                  pvVar14 = (void *)((long)pvVar14 - 8);
                } while (pvVar4 < pvVar14);
              }
              if (0 < (int)this->_width) {
                lVar15 = 0;
                pvVar14 = pvVar4;
                do {
                  if (0 < (int)this->_spectrum) {
                    lVar7 = 0;
                    lVar12 = 0;
                    do {
                      lVar13 = (ulong)this->_height * (ulong)this->_width;
                      this->_data
                      [(ulong)this->_depth * lVar12 * lVar13 +
                       lVar13 * lVar8 + lVar15 + lVar17 * (ulong)this->_width] =
                           (uchar)(int)*(double *)((long)pvVar14 + lVar12 * 8);
                      lVar12 = lVar12 + 1;
                      lVar7 = lVar7 + 8;
                    } while (lVar12 < (int)this->_spectrum);
                    pvVar14 = (void *)((long)pvVar14 + lVar7);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (int)this->_width);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)this->_height);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_depth);
      }
      operator_delete__(pvVar4);
      bVar2 = true;
    }
    if ((((!bVar2) && (local_50 == 0x40)) && (local_58 == 1)) && (local_54 == 1)) {
      pvVar4 = operator_new__(-(ulong)((ulong)((long)(int)local_5c * (long)(int)local_68) >> 0x3d !=
                                      0) | (long)(int)local_5c * (long)(int)local_68 * 8);
      if (0 < (int)this->_depth) {
        lVar8 = 0;
        do {
          if (0 < (int)this->_height) {
            lVar17 = 0;
            do {
              sVar16 = (long)(int)local_5c * (long)(int)local_68;
              if ((FILE *)file == (FILE *)0x0) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar9 = "";
                if (1 < (uint)sVar16) {
                  pcVar9 = "s";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                           ,sVar16,"double",pcVar9,0,pvVar4);
LAB_001adbf9:
                __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
              }
              if ((uint)sVar16 != 0) {
                lVar15 = 0;
                local_48 = sVar16;
                do {
                  sVar5 = 0x7e0000;
                  if (sVar16 * 8 < 0x3f00000) {
                    sVar5 = sVar16;
                  }
                  sVar6 = fread((void *)((long)pvVar4 + lVar15 * 8),8,sVar5,(FILE *)file);
                  lVar15 = lVar15 + sVar6;
                  sVar16 = sVar16 - sVar6;
                } while ((sVar5 == sVar6) && (sVar16 != 0));
                if (sVar16 != 0) {
                  cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.");
                }
              }
              if ((local_4c != 0) && (0 < (int)(local_5c * local_68))) {
                pvVar14 = (void *)((ulong)(local_5c * local_68) * 8 + (long)pvVar4);
                do {
                  uVar18 = *(ulong *)((long)pvVar14 - 8);
                  *(ulong *)((long)pvVar14 - 8) =
                       uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                       (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                       (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                       (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
                  pvVar14 = (void *)((long)pvVar14 - 8);
                } while (pvVar4 < pvVar14);
              }
              if (0 < (int)this->_width) {
                lVar15 = 0;
                pvVar14 = pvVar4;
                do {
                  if (0 < (int)this->_spectrum) {
                    lVar7 = 0;
                    lVar12 = 0;
                    do {
                      lVar13 = (ulong)this->_height * (ulong)this->_width;
                      this->_data
                      [(ulong)this->_depth * lVar12 * lVar13 +
                       lVar13 * lVar8 + lVar15 + lVar17 * (ulong)this->_width] =
                           (uchar)(int)*(double *)((long)pvVar14 + lVar12 * 8);
                      lVar12 = lVar12 + 1;
                      lVar7 = lVar7 + 8;
                    } while (lVar12 < (int)this->_spectrum);
                    pvVar14 = (void *)((long)pvVar14 + lVar7);
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < (int)this->_width);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)this->_height);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)this->_depth);
      }
      operator_delete__(pvVar4);
      bVar2 = true;
    }
    if (bVar2) {
      if (local_40 == (FILE *)0x0) {
        if ((FILE *)file == (FILE *)0x0) {
          cimg::warn("cimg::fclose(): Specified file is (null).");
        }
        else if ((_stdin != (FILE *)file) && (_stdout != (FILE *)file)) {
          uVar3 = fclose((FILE *)file);
          if (uVar3 != 0) {
            cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar3);
          }
        }
      }
      return this;
    }
    if (local_40 == (FILE *)0x0) {
      cimg::fclose((FILE *)file);
    }
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar9 = "non-";
    if (this->_is_shared != false) {
      pcVar9 = "";
    }
    pcVar11 = "(FILE*)";
    if (local_38 != (char *)0x0) {
      pcVar11 = local_38;
    }
    CImgIOException::CImgIOException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_inr(): Unknown pixel type defined in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar9,"unsigned char",pcVar11);
    ppuVar10 = &CImgIOException::typeinfo;
  }
  __cxa_throw(this_01,ppuVar10,CImgException::~CImgException);
}

Assistant:

CImg<T>& _load_inr(std::FILE *const file, const char *const filename, float *const voxel_size) {
#define _cimg_load_inr_case(Tf,sign,pixsize,Ts) \
     if (!loaded && fopt[6]==pixsize && fopt[4]==Tf && fopt[5]==sign) { \
        Ts *xval, *const val = new Ts[(size_t)fopt[0]*fopt[3]]; \
        cimg_forYZ(*this,y,z) { \
            cimg::fread(val,fopt[0]*fopt[3],nfile); \
            if (fopt[7]!=endian) cimg::invert_endianness(val,fopt[0]*fopt[3]); \
            xval = val; cimg_forX(*this,x) cimg_forC(*this,c) (*this)(x,y,z,c) = (T)*(xval++); \
          } \
        delete[] val; \
        loaded = true; \
      }

      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_inr(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      int fopt[8], endian = cimg::endianness()?1:0;
      bool loaded = false;
      if (voxel_size) voxel_size[0] = voxel_size[1] = voxel_size[2] = 1;
      _load_inr_header(nfile,fopt,voxel_size);
      assign(fopt[0],fopt[1],fopt[2],fopt[3]);
      _cimg_load_inr_case(0,0,8,unsigned char);
      _cimg_load_inr_case(0,1,8,char);
      _cimg_load_inr_case(0,0,16,unsigned short);
      _cimg_load_inr_case(0,1,16,short);
      _cimg_load_inr_case(0,0,32,unsigned int);
      _cimg_load_inr_case(0,1,32,int);
      _cimg_load_inr_case(1,0,32,float);
      _cimg_load_inr_case(1,1,32,float);
      _cimg_load_inr_case(1,0,64,double);
      _cimg_load_inr_case(1,1,64,double);
      if (!loaded) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_inr(): Unknown pixel type defined in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }